

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O1

void __thiscall wasm::Module::updateDataSegmentsMap(Module *this)

{
  pointer puVar1;
  mapped_type __k;
  mapped_type *ppDVar2;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *curr;
  pointer puVar3;
  
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::DataSegment_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::DataSegment_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->dataSegmentsMap)._M_h);
  puVar1 = (this->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->dataSegments).
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    __k = (puVar3->_M_t).
          super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
          super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
          super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
    ppDVar2 = std::__detail::
              _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DataSegment_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::DataSegment_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DataSegment_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::DataSegment_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->dataSegmentsMap,(key_type *)__k);
    *ppDVar2 = __k;
  }
  return;
}

Assistant:

void Module::updateDataSegmentsMap() {
  dataSegmentsMap.clear();
  for (auto& curr : dataSegments) {
    dataSegmentsMap[curr->name] = curr.get();
  }
}